

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void FM_STATUS_SET(FM_ST *ST,int flag)

{
  byte bVar1;
  
  bVar1 = (byte)flag | ST->status;
  ST->status = bVar1;
  if ((ST->irq == '\0') && ((ST->irqmask & bVar1) != 0)) {
    ST->irq = '\x01';
    if (ST->IRQ_Handler != (FM_IRQHANDLER)0x0) {
      (*ST->IRQ_Handler)(ST->param,'\x01');
      return;
    }
  }
  return;
}

Assistant:

INLINE void FM_STATUS_SET(FM_ST *ST,int flag)
{
	/* set status flag */
	ST->status |= flag;
	if ( !(ST->irq) && (ST->status & ST->irqmask) )
	{
		ST->irq = 1;
		/* callback user interrupt handler (IRQ is OFF to ON) */
		if(ST->IRQ_Handler) (ST->IRQ_Handler)(ST->param,1);
	}
}